

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

bool __thiscall
re2::Prog::SearchNFA
          (Prog *this,StringPiece *text,StringPiece *context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  bool bVar1;
  const_iterator pcVar2;
  const_iterator pcVar3;
  StringPiece *in_RSI;
  int in_R8D;
  StringPiece *in_R9;
  int in_stack_00000008;
  StringPiece sp;
  NFA nfa;
  StringPiece *in_stack_000004a8;
  undefined1 in_stack_000004b6;
  undefined1 in_stack_000004b7;
  StringPiece *in_stack_000004b8;
  StringPiece *in_stack_000004c0;
  NFA *in_stack_000004c8;
  int in_stack_000004e0;
  undefined4 in_stack_ffffffffffffff14;
  StringPiece local_e0 [3];
  Prog *in_stack_ffffffffffffff58;
  NFA *in_stack_ffffffffffffff60;
  StringPiece *local_30;
  bool local_1;
  
  NFA::NFA(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  StringPiece::StringPiece(local_e0);
  local_30 = in_R9;
  if ((in_R8D == 2) && (in_stack_00000008 == 0)) {
    local_30 = local_e0;
    in_stack_00000008 = 1;
  }
  bVar1 = NFA::Search(in_stack_000004c8,in_stack_000004c0,in_stack_000004b8,(bool)in_stack_000004b7,
                      (bool)in_stack_000004b6,in_stack_000004a8,in_stack_000004e0);
  if (bVar1) {
    if (in_R8D == 2) {
      pcVar2 = StringPiece::end(local_30);
      pcVar3 = StringPiece::end(in_RSI);
      if (pcVar2 != pcVar3) {
        local_1 = false;
        goto LAB_0024c668;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
LAB_0024c668:
  NFA::~NFA((NFA *)CONCAT44(in_stack_ffffffffffffff14,1));
  return local_1;
}

Assistant:

bool
Prog::SearchNFA(const StringPiece& text, const StringPiece& context,
                Anchor anchor, MatchKind kind,
                StringPiece* match, int nmatch) {
  if (ExtraDebug)
    Dump();

  NFA nfa(this);
  StringPiece sp;
  if (kind == kFullMatch) {
    anchor = kAnchored;
    if (nmatch == 0) {
      match = &sp;
      nmatch = 1;
    }
  }
  if (!nfa.Search(text, context, anchor == kAnchored, kind != kFirstMatch, match, nmatch))
    return false;
  if (kind == kFullMatch && match[0].end() != text.end())
    return false;
  return true;
}